

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

uint If_DsdManCheckXY(If_DsdMan_t *p,int iDsd,int LutSize,int fDerive,uint uMaskNot,int fHighEffort,
                     int fVerbose)

{
  word *pRes;
  uint uVar1;
  
  uVar1 = If_DsdManCheckXY_int(p,iDsd,LutSize,fDerive,uMaskNot,fVerbose);
  if (fHighEffort == 0 || uVar1 != 0) {
    return uVar1;
  }
  if (-1 < iDsd) {
    if ((int)((uint)iDsd >> 1) < (p->vObjs).nSize) {
      uVar1 = *(uint *)((long)(p->vObjs).pArray[(uint)iDsd >> 1] + 4);
      pRes = p->pTtElems[0xc];
      If_DsdManComputeTruthPtr(p,iDsd,(uchar *)0x0,pRes);
      uVar1 = If_ManSatCheckXYall(p->pSat,LutSize,pRes,uVar1 >> 3 & 0x1f,p->vTemp1);
      return uVar1;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12f,"int Abc_Lit2Var(int)");
}

Assistant:

unsigned If_DsdManCheckXY( If_DsdMan_t * p, int iDsd, int LutSize, int fDerive, unsigned uMaskNot, int fHighEffort, int fVerbose )
{
    unsigned uSet = If_DsdManCheckXY_int( p, iDsd, LutSize, fDerive, uMaskNot, fVerbose );
    if ( uSet == 0 && fHighEffort )
    {
//        abctime clk = Abc_Clock();
        int nVars = If_DsdVecLitSuppSize( &p->vObjs, iDsd );
        word * pRes = If_DsdManComputeTruth( p, iDsd, NULL );
        uSet = If_ManSatCheckXYall( p->pSat, LutSize, pRes, nVars, p->vTemp1 );
        if ( uSet )
        {
//            If_DsdManPrintOne( stdout, p, Abc_Lit2Var(iDsd), NULL, 1 );
//            Dau_DecPrintSet( uSet, nVars, 1 );
        }
//        p->timeCheck2 += Abc_Clock() - clk;
    }
    return uSet;
}